

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O3

size_t __thiscall lattice::graph::add_bond(graph *this,size_t s,size_t t,int tp)

{
  pointer *ppbVar1;
  iterator __position;
  iterator iVar2;
  ulong uVar3;
  pointer psVar4;
  invalid_argument *this_00;
  unsigned_long uVar5;
  size_t b;
  unsigned_long local_50;
  size_t local_48;
  unsigned_long local_40;
  bond_t local_38;
  
  uVar3 = ((long)(this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_48 = t;
  local_40 = s;
  if ((uVar3 < s || uVar3 - s == 0) || (uVar3 < t || uVar3 - t == 0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"site index out of range");
  }
  else {
    if (s != t) {
      __position._M_current =
           (this->bonds_).
           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      uVar5 = ((long)__position._M_current -
               (long)(this->bonds_).
                     super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_50 = uVar5;
      local_38.source = s;
      local_38.target = t;
      local_38.type = tp;
      if (__position._M_current ==
          (this->bonds_).
          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::
        _M_realloc_insert<lattice::graph::bond_t>(&this->bonds_,__position,&local_38);
      }
      else {
        *(ulong *)&(__position._M_current)->type = CONCAT44(local_38._20_4_,tp);
        (__position._M_current)->source = s;
        (__position._M_current)->target = t;
        ppbVar1 = &(this->bonds_).
                   super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      psVar4 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar2._M_current =
           *(pointer *)
            ((long)&psVar4[s].neighbors.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&psVar4[s].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psVar4[s].neighbors,iVar2
                   ,&local_48);
        psVar4 = (this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar2._M_current = t;
        *(unsigned_long **)
         ((long)&psVar4[s].neighbors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar2._M_current + 1;
      }
      iVar2._M_current =
           *(pointer *)
            ((long)&psVar4[s].neighbor_bonds.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&psVar4[s].neighbor_bonds.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psVar4[s].neighbor_bonds,
                   iVar2,&local_50);
        psVar4 = (this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar2._M_current = uVar5;
        *(unsigned_long **)
         ((long)&psVar4[s].neighbor_bonds.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar2._M_current + 1;
      }
      iVar2._M_current =
           *(pointer *)
            ((long)&psVar4[local_48].neighbors.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&psVar4[local_48].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar4[local_48].neighbors,iVar2,&local_40);
        psVar4 = (this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar2._M_current = local_40;
        *(unsigned_long **)
         ((long)&psVar4[local_48].neighbors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar2._M_current + 1;
      }
      iVar2._M_current =
           *(pointer *)
            ((long)&psVar4[local_48].neighbor_bonds.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar2._M_current ==
          *(pointer *)
           ((long)&psVar4[local_48].neighbor_bonds.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar4[local_48].neighbor_bonds,iVar2,&local_50);
      }
      else {
        *iVar2._M_current = local_50;
        *(unsigned_long **)
         ((long)&psVar4[local_48].neighbor_bonds.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar2._M_current + 1;
      }
      return local_50;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"self loop is not allowed");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, int tp) {
    if (s >= sites_.size() || t >= sites_.size())
      throw std::invalid_argument("site index out of range");
    if (s == t)
      throw std::invalid_argument("self loop is not allowed");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, tp));
    sites_[s].neighbors.push_back(t);
    sites_[s].neighbor_bonds.push_back(b);
    sites_[t].neighbors.push_back(s);
    sites_[t].neighbor_bonds.push_back(b);
    return b;
  }